

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrForceFeedbackCurlApplyLocationsMNDX *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  ulong uVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  long lVar4;
  XrResult XVar5;
  allocator local_171;
  GenValidUsageXrInstanceInfo *local_170;
  string *local_168;
  allocator local_159;
  string local_158;
  string error_message;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string local_f8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar5 = XR_SUCCESS;
  local_170 = instance_info;
  local_168 = command_name;
  if (value->type != XR_TYPE_FORCE_FEEDBACK_CURL_APPLY_LOCATIONS_MNDX) {
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrForceFeedbackCurlApplyLocationsMNDX",
               value->type,"VUID-XrForceFeedbackCurlApplyLocationsMNDX-type-type",
               XR_TYPE_FORCE_FEEDBACK_CURL_APPLY_LOCATIONS_MNDX,
               "XR_TYPE_FORCE_FEEDBACK_CURL_APPLY_LOCATIONS_MNDX");
  }
  if (!check_pnext) goto LAB_001a5d75;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(local_170,local_168,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_158);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_158,local_170,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::string
              ((string *)&local_158,"VUID-XrForceFeedbackCurlApplyLocationsMNDX-next-unique",
               &local_171);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,objects_info);
    std::__cxx11::string::string
              ((string *)&local_f8,
               "Multiple structures of the same type(s) in \"next\" chain for XrForceFeedbackCurlApplyLocationsMNDX struct"
               ,&local_159);
    CoreValidLogMessage(local_170,&local_158,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_168,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_158);
LAB_001a5d43:
    std::__cxx11::string::~string((string *)&error_message);
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrForceFeedbackCurlApplyLocationsMNDX-next-next",
               (allocator *)&local_f8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    std::__cxx11::string::string
              ((string *)&local_158,
               "Invalid structure(s) in \"next\" chain for XrForceFeedbackCurlApplyLocationsMNDX struct \"next\""
               ,&local_171);
    CoreValidLogMessage(local_170,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_168,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_001a5d43;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001a5d75:
  if (check_members && XVar5 == XR_SUCCESS) {
    XVar5 = XR_SUCCESS;
    if ((value->locationCount == 0) &&
       (value->locations != (XrForceFeedbackCurlApplyLocationMNDX *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrForceFeedbackCurlApplyLocationsMNDX-locationCount-arraylength",
                 (allocator *)&local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,objects_info);
      std::__cxx11::string::string
                ((string *)&local_158,
                 "Structure XrForceFeedbackCurlApplyLocationsMNDX member locationCount is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_170,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_168,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_90);
      std::__cxx11::string::~string((string *)&error_message);
      XVar5 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->locations == (XrForceFeedbackCurlApplyLocationMNDX *)0x0) {
      if (value->locationCount == 0) {
        return XVar5;
      }
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrForceFeedbackCurlApplyLocationsMNDX-locations-parameter",
                 (allocator *)&local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_a8,objects_info);
      std::__cxx11::string::string
                ((string *)&local_158,
                 "XrForceFeedbackCurlApplyLocationsMNDX contains invalid NULL for XrForceFeedbackCurlApplyLocationMNDX \"locations\" is which not optional since \"locationCount\" is set and must be non-NULL"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_170,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_168,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_a8,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      this = &local_a8;
    }
    else {
      uVar3 = 0xffffffffffffffff;
      lVar4 = 0;
      do {
        uVar3 = uVar3 + 1;
        if (value->locationCount <= uVar3) {
          return XVar5;
        }
        XVar5 = XR_SUCCESS;
        XVar2 = ValidateXrStruct(local_170,local_168,objects_info,true,false,
                                 (XrForceFeedbackCurlApplyLocationMNDX *)
                                 ((long)&value->locations->location + lVar4));
        lVar4 = lVar4 + 8;
      } while (XVar2 == XR_SUCCESS);
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrForceFeedbackCurlApplyLocationsMNDX-locations-parameter",
                 (allocator *)&local_f8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_c0,objects_info);
      std::__cxx11::string::string
                ((string *)&local_158,
                 "Structure XrForceFeedbackCurlApplyLocationsMNDX member locations is invalid",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(local_170,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_168,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_c0,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      this = &local_c0;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&error_message);
    XVar5 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar5;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrForceFeedbackCurlApplyLocationsMNDX* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FORCE_FEEDBACK_CURL_APPLY_LOCATIONS_MNDX) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrForceFeedbackCurlApplyLocationsMNDX",
                             value->type, "VUID-XrForceFeedbackCurlApplyLocationsMNDX-type-type", XR_TYPE_FORCE_FEEDBACK_CURL_APPLY_LOCATIONS_MNDX, "XR_TYPE_FORCE_FEEDBACK_CURL_APPLY_LOCATIONS_MNDX");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrForceFeedbackCurlApplyLocationsMNDX-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrForceFeedbackCurlApplyLocationsMNDX struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrForceFeedbackCurlApplyLocationsMNDX : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrForceFeedbackCurlApplyLocationsMNDX-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrForceFeedbackCurlApplyLocationsMNDX struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->locationCount && nullptr != value->locations) {
        CoreValidLogMessage(instance_info, "VUID-XrForceFeedbackCurlApplyLocationsMNDX-locationCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrForceFeedbackCurlApplyLocationsMNDX member locationCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->locations && 0 != value->locationCount) {
        CoreValidLogMessage(instance_info, "VUID-XrForceFeedbackCurlApplyLocationsMNDX-locations-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrForceFeedbackCurlApplyLocationsMNDX contains invalid NULL for XrForceFeedbackCurlApplyLocationMNDX \"locations\" is which not "
                            "optional since \"locationCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->locations) {
        for (uint32_t value_locations_inc = 0; value_locations_inc < value->locationCount; ++value_locations_inc) {
            // Validate that the structure XrForceFeedbackCurlApplyLocationMNDX is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, &value->locations[value_locations_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrForceFeedbackCurlApplyLocationsMNDX-locations-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrForceFeedbackCurlApplyLocationsMNDX member locations is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}